

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.h
# Opt level: O1

void __thiscall chrono::ChSystem::RemoveBody(ChSystem *this,shared_ptr<chrono::ChBody> *body)

{
  element_type *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  local_18 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_10 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_10->_M_use_count = local_10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_10->_M_use_count = local_10->_M_use_count + 1;
    }
  }
  chrono::ChAssembly::RemoveBody(this + 8,&local_18);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

virtual void RemoveBody(std::shared_ptr<ChBody> body) { assembly.RemoveBody(body); }